

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall QNetworkRequest::setPriority(QNetworkRequest *this,Priority priority)

{
  QNetworkRequestPrivate *pQVar1;
  Priority in_ESI;
  
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QNetworkRequestPrivate> *)CONCAT44(in_ESI,in_ESI));
  pQVar1->priority = in_ESI;
  return;
}

Assistant:

void QNetworkRequest::setPriority(Priority priority)
{
    d->priority = priority;
}